

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeBlock
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig)

{
  Block *curr;
  Block *block;
  IRBuilder *this_local;
  Signature sig_local;
  Name label_local;
  
  sig_local.params = sig.results.id;
  sig_local.results.id = label.super_IString.str._M_len;
  curr = MixedArena::alloc<wasm::Block>(&this->wasm->allocator);
  wasm::Name::operator=(&curr->name,(Name *)&sig_local.results);
  (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
       sig_local.params.id;
  visitBlockStart(__return_storage_ptr__,this,curr,sig.params.id);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeBlock(Name label, Signature sig) {
  auto* block = wasm.allocator.alloc<Block>();
  block->name = label;
  block->type = sig.results;
  return visitBlockStart(block, sig.params);
}